

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# balk.cpp
# Opt level: O0

void __thiscall Balk::func(Balk *this,int degree,double value)

{
  bool bVar1;
  int iVar2;
  element_type *peVar3;
  double extraout_XMM0_Qa;
  value_type_conflict1 local_80 [3];
  value_type_conflict1 local_68;
  __shared_ptr_access<Term,_(__gnu_cxx::_Lock_policy)2,_false,_false> *local_60;
  shared_ptr<Term> *el;
  iterator __end1;
  iterator __begin1;
  vector<std::shared_ptr<Term>,_std::allocator<std::shared_ptr<Term>_>_> *__range1;
  double right_part;
  vector<double,_std::allocator<double>_> vec;
  double value_local;
  int degree_local;
  Balk *this_local;
  
  vec.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)value;
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)&right_part);
  __range1 = (vector<std::shared_ptr<Term>,_std::allocator<std::shared_ptr<Term>_>_> *)0x0;
  __end1 = std::vector<std::shared_ptr<Term>,_std::allocator<std::shared_ptr<Term>_>_>::begin
                     (&this->terms);
  el = (shared_ptr<Term> *)
       std::vector<std::shared_ptr<Term>,_std::allocator<std::shared_ptr<Term>_>_>::end
                 (&this->terms);
  do {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<std::shared_ptr<Term>_*,_std::vector<std::shared_ptr<Term>,_std::allocator<std::shared_ptr<Term>_>_>_>
                                *)&el);
    if (!bVar1) {
      std::
      vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
      ::push_back(&this->A,(value_type *)&right_part);
      local_80[0] = -(double)__range1;
      std::vector<double,_std::allocator<double>_>::push_back(&this->b,local_80);
      std::vector<double,_std::allocator<double>_>::~vector
                ((vector<double,_std::allocator<double>_> *)&right_part);
      return;
    }
    local_60 = (__shared_ptr_access<Term,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               __gnu_cxx::
               __normal_iterator<std::shared_ptr<Term>_*,_std::vector<std::shared_ptr<Term>,_std::allocator<std::shared_ptr<Term>_>_>_>
               ::operator*(&__end1);
    peVar3 = std::__shared_ptr_access<Term,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                       (local_60);
    bVar1 = Term::isUnknown(peVar3);
    if (bVar1) {
      peVar3 = std::__shared_ptr_access<Term,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                         (local_60);
      if ((peVar3->initial_variable & 1U) == 0) {
        peVar3 = std::__shared_ptr_access<Term,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->(local_60);
        iVar2 = Term::getShift(peVar3);
        if (iVar2 != 0) {
          peVar3 = std::__shared_ptr_access<Term,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                   operator->(local_60);
          iVar2 = Term::getShift(peVar3);
          if (iVar2 != this->balk_size) goto LAB_001061a1;
        }
        goto LAB_00106200;
      }
LAB_001061a1:
      peVar3 = std::__shared_ptr_access<Term,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                         (local_60);
      (*peVar3->_vptr_Term[2])
                (vec.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage,peVar3,(ulong)(uint)degree);
      std::vector<double,_std::allocator<double>_>::push_back
                ((vector<double,_std::allocator<double>_> *)&right_part,&local_68);
    }
    else {
LAB_00106200:
      peVar3 = std::__shared_ptr_access<Term,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                         (local_60);
      (*peVar3->_vptr_Term[2])
                (vec.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage,peVar3,(ulong)(uint)degree);
      __range1 = (vector<std::shared_ptr<Term>,_std::allocator<std::shared_ptr<Term>_>_> *)
                 (extraout_XMM0_Qa + (double)__range1);
    }
    __gnu_cxx::
    __normal_iterator<std::shared_ptr<Term>_*,_std::vector<std::shared_ptr<Term>,_std::allocator<std::shared_ptr<Term>_>_>_>
    ::operator++(&__end1);
  } while( true );
}

Assistant:

void Balk::func(int degree, double value)
{
    std::vector<double> vec;
    double right_part = 0;
    for (auto &el : terms)
    {
        if ((el->isUnknown()) && (el->initial_variable || ((el->getShift() != 0) && (el->getShift() != balk_size))))
        {
            vec.push_back(el->calculate(value, degree));
        }
        else
        {
            right_part += el->calculate(value, degree);
        }
    }
    A.push_back(std::move(vec));
    b.push_back(-right_part);
}